

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop_measures.cc
# Opt level: O3

bool __thiscall S2::IsOrderLess(S2 *this,LoopOrder order1,LoopOrder order2,S2PointLoopSpan loop)

{
  double dVar1;
  double dVar2;
  double *ap_1;
  reference pVVar3;
  reference pVVar4;
  long lVar5;
  byte bVar6;
  double *bp;
  uint i;
  uint uVar7;
  double *ap;
  bool bVar8;
  S2PointLoopSpan local_68;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  S2LogMessage local_40;
  
  local_68.super_S2PointSpan.len_ = (size_type)loop.super_S2PointSpan.ptr_;
  if ((LoopOrder)this == order1) {
    bVar8 = false;
  }
  else {
    local_48 = (ulong)this >> 0x20;
    local_50 = (ulong)order1 >> 0x20;
    local_68.super_S2PointSpan.ptr_ = (pointer)order2;
    pVVar3 = S2PointLoopSpan::operator[](&local_68,(int)this);
    pVVar4 = S2PointLoopSpan::operator[](&local_68,order1.first);
    lVar5 = 0;
    do {
      dVar1 = *(double *)((long)pVVar3->c_ + lVar5);
      dVar2 = *(double *)((long)pVVar4->c_ + lVar5);
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
      bVar8 = lVar5 != 0x10;
      lVar5 = lVar5 + 8;
    } while (bVar8);
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
      S2LogMessage::S2LogMessage
                (&local_40,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop_measures.cc"
                 ,0xfd,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_40.stream_,"Check failed: (loop[i1]) == (loop[i2]) ",0x27);
      abort();
    }
    uVar7 = (uint)local_68.super_S2PointSpan.len_;
    if ((int)(uint)local_68.super_S2PointSpan.len_ < 2) {
      bVar6 = 0;
    }
    else {
      do {
        local_58 = (ulong)uVar7;
        i = (int)this + (int)local_48;
        this = (S2 *)(ulong)i;
        order1.first = order1.first + (int)local_50;
        order1.dir = 0;
        pVVar3 = S2PointLoopSpan::operator[](&local_68,i);
        pVVar4 = S2PointLoopSpan::operator[](&local_68,order1.first);
        lVar5 = 0;
        do {
          dVar1 = *(double *)((long)pVVar3->c_ + lVar5);
          dVar2 = *(double *)((long)pVVar4->c_ + lVar5);
          bVar6 = 1;
          if (dVar1 < dVar2) {
            pVVar4 = (reference)0x1;
            goto LAB_001ff88d;
          }
        } while ((dVar1 <= dVar2) && (bVar8 = lVar5 != 0x10, lVar5 = lVar5 + 8, bVar8));
        pVVar3 = S2PointLoopSpan::operator[](&local_68,i);
        pVVar4 = S2PointLoopSpan::operator[](&local_68,order1.first);
        lVar5 = 0;
        do {
          dVar1 = *(double *)((long)pVVar4->c_ + lVar5);
          dVar2 = *(double *)((long)pVVar3->c_ + lVar5);
          if (dVar1 < dVar2) {
            pVVar4 = (reference)0x0;
            goto LAB_001ff88d;
          }
        } while ((dVar1 <= dVar2) && (bVar8 = lVar5 != 0x10, lVar5 = lVar5 + 8, bVar8));
        bVar6 = 0;
        uVar7 = uVar7 - 1;
      } while (2 < (int)local_58);
    }
LAB_001ff88d:
    bVar8 = (bool)(bVar6 & (byte)pVVar4);
  }
  return bVar8;
}

Assistant:

static inline bool IsOrderLess(LoopOrder order1, LoopOrder order2,
                               S2PointLoopSpan loop) {
  if (order1 == order2) return false;

  int i1 = order1.first, i2 = order2.first;
  int dir1 = order1.dir, dir2 = order2.dir;
  S2_DCHECK_EQ(loop[i1], loop[i2]);
  for (int n = loop.size(); --n > 0; ) {
    i1 += dir1;
    i2 += dir2;
    if (loop[i1] < loop[i2]) return true;
    if (loop[i1] > loop[i2]) return false;
  }
  return false;
}